

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O1

int dwarf_get_ISA_name(uint val,char **s_out)

{
  int iVar1;
  
  iVar1 = -1;
  if (val < 3) {
    *s_out = &DAT_001f5160 + *(int *)(&DAT_001f5160 + (ulong)val * 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_ISA_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ISA_UNKNOWN:
        *s_out = "DW_ISA_UNKNOWN";
        return DW_DLV_OK;
    case DW_ISA_ARM_thumb:
        *s_out = "DW_ISA_ARM_thumb";
        return DW_DLV_OK;
    case DW_ISA_ARM_arm:
        *s_out = "DW_ISA_ARM_arm";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}